

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void alEventControlSOFT(ALsizei count,ALenum *types,ALboolean enable)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  ContextRef context;
  ALbitfieldSOFT flags;
  intrusive_ptr<ALCcontext> local_50;
  uint local_44;
  _Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_rbetik12[P]FallingSand_lib_vx_sound_lib_openal_al_event_cpp:146:9)>
  local_40;
  uint *local_38;
  
  GetContextRef();
  if (local_50.mPtr == (ALCcontext *)0x0) goto LAB_0011cec2;
  if (count < 0) {
    ALCcontext::setError(local_50.mPtr,0xa003,"Controlling %d events",(ulong)(uint)count);
    goto LAB_0011cec2;
  }
  if (count == 0) goto LAB_0011cec2;
  if (types == (ALenum *)0x0) {
    ALCcontext::setError(local_50.mPtr,0xa003,"NULL pointer");
    goto LAB_0011cec2;
  }
  local_40._M_pred.flags = (anon_class_8_1_a7e9dda7)&local_44;
  local_44 = 0;
  local_38 = (uint *)(types + (uint)count);
  lVar4 = (ulong)(uint)count << 2;
  for (uVar6 = (ulong)((uint)count >> 2); puVar5 = (uint *)types, 0 < (long)uVar6; uVar6 = uVar6 - 1
      ) {
    bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()(&local_40,types);
    if (bVar2) goto LAB_0011ce2c;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()
                      (&local_40,(int *)((uint *)types + 1));
    puVar5 = (uint *)types + 1;
    if (bVar2) goto LAB_0011ce2c;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()
                      (&local_40,(int *)((uint *)types + 2));
    puVar5 = (uint *)types + 2;
    if (bVar2) goto LAB_0011ce2c;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()
                      (&local_40,(int *)((uint *)types + 3));
    puVar5 = (uint *)types + 3;
    if (bVar2) goto LAB_0011ce2c;
    types = (ALenum *)((uint *)types + 4);
    lVar4 = lVar4 + -0x10;
  }
  lVar4 = lVar4 >> 2;
  if (lVar4 == 1) {
LAB_0011ce55:
    bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()(&local_40,types);
    puVar5 = (uint *)types;
    if (bVar2) goto LAB_0011ce2c;
  }
  else {
    if (lVar4 == 2) {
LAB_0011ce18:
      bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()
                        (&local_40,(int *)puVar5);
      if (!bVar2) {
        types = (ALenum *)(puVar5 + 1);
        goto LAB_0011ce55;
      }
    }
    else {
      if (lVar4 != 3) goto LAB_0011ce69;
      bVar2 = __gnu_cxx::__ops::_Iter_negate<alEventControlSOFT::$_0>::operator()(&local_40,types);
      if (!bVar2) {
        puVar5 = (uint *)types + 1;
        goto LAB_0011ce18;
      }
    }
LAB_0011ce2c:
    if (puVar5 != local_38) {
      ALCcontext::setError(local_50.mPtr,0xa002,"Invalid event type 0x%04x",(ulong)*puVar5);
      goto LAB_0011cec2;
    }
  }
LAB_0011ce69:
  uVar3 = ((local_50.mPtr)->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
  if (enable == '\0') {
    do {
      LOCK();
      uVar1 = ((local_50.mPtr)->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
      bVar2 = uVar3 == uVar1;
      if (bVar2) {
        ((local_50.mPtr)->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = ~local_44 & uVar3;
        uVar1 = uVar3;
      }
      uVar3 = uVar1;
      UNLOCK();
    } while (!bVar2);
    std::mutex::lock(&(local_50.mPtr)->mEventCbLock);
    pthread_mutex_unlock((pthread_mutex_t *)&(local_50.mPtr)->mEventCbLock);
  }
  else {
    do {
      LOCK();
      uVar1 = ((local_50.mPtr)->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
      bVar2 = uVar3 == uVar1;
      if (bVar2) {
        ((local_50.mPtr)->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = local_44 | uVar3;
        uVar1 = uVar3;
      }
      uVar3 = uVar1;
      UNLOCK();
    } while (!bVar2);
  }
LAB_0011cec2:
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&local_50);
  return;
}

Assistant:

AL_API void AL_APIENTRY alEventControlSOFT(ALsizei count, const ALenum *types, ALboolean enable)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if(count < 0) context->setError(AL_INVALID_VALUE, "Controlling %d events", count);
    if(count <= 0) return;
    if(!types) SETERR_RETURN(context, AL_INVALID_VALUE,, "NULL pointer");

    ALbitfieldSOFT flags{0};
    const ALenum *types_end = types+count;
    auto bad_type = std::find_if_not(types, types_end,
        [&flags](ALenum type) noexcept -> bool
        {
            if(type == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
                flags |= EventType_BufferCompleted;
            else if(type == AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT)
                flags |= EventType_SourceStateChange;
            else if(type == AL_EVENT_TYPE_DISCONNECTED_SOFT)
                flags |= EventType_Disconnected;
            else
                return false;
            return true;
        }
    );
    if(bad_type != types_end)
        SETERR_RETURN(context, AL_INVALID_ENUM,, "Invalid event type 0x%04x", *bad_type);

    if(enable)
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts|flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
            /* enabledevts is (re-)filled with the current value on failure, so
             * just try again.
             */
        }
    }
    else
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts&~flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
        }
        /* Wait to ensure the event handler sees the changed flags before
         * returning.
         */
        std::lock_guard<std::mutex>{context->mEventCbLock};
    }
}